

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator/=(base_uint<256U> *this,base_uint<256U> *b)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  int shift;
  int div_bits;
  int num_bits;
  base_uint<256U> num;
  base_uint<256U> div;
  string *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  base_uint<256U> *in_stack_ffffffffffffff40;
  int local_a4;
  allocator<char> *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint((base_uint<256U> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
            (base_uint<256U> *)in_stack_ffffffffffffff30);
  base_uint((base_uint<256U> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
            (base_uint<256U> *)in_stack_ffffffffffffff30);
  operator=((base_uint<256U> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
            (uint64_t)in_stack_ffffffffffffff30);
  uVar3 = bits(in_stack_ffffffffffffff40);
  uVar4 = bits(in_stack_ffffffffffffff40);
  if (uVar4 == 0) {
    uVar5 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,(char *)CONCAT44(uVar3,uVar4),in_stack_ffffffffffffff68);
    uint_error::uint_error
              ((uint_error *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff30);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar5,&uint_error::typeinfo,uint_error::~uint_error);
    }
  }
  else {
    if ((int)uVar4 <= (int)uVar3) {
      operator<<=((base_uint<256U> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                  (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      for (local_a4 = uVar3 - uVar4; -1 < local_a4; local_a4 = local_a4 + -1) {
        bVar2 = operator>=((base_uint<256U> *)
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           (base_uint<256U> *)in_stack_ffffffffffffff30);
        if (bVar2) {
          operator-=((base_uint<256U> *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (base_uint<256U> *)in_stack_ffffffffffffff30);
          in_stack_ffffffffffffff3c = 1 << ((byte)local_a4 & 0x1f);
          in_RDI->pn[local_a4 / 0x20] = in_stack_ffffffffffffff3c | in_RDI->pn[local_a4 / 0x20];
        }
        operator>>=((base_uint<256U> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                    ,(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return in_RDI;
    }
  }
  __stack_chk_fail();
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator/=(const base_uint& b)
{
    base_uint<BITS> div = b;     // make a copy, so we can shift.
    base_uint<BITS> num = *this; // make a copy, so we can subtract.
    *this = 0;                   // the quotient.
    int num_bits = num.bits();
    int div_bits = div.bits();
    if (div_bits == 0)
        throw uint_error("Division by zero");
    if (div_bits > num_bits) // the result is certainly 0.
        return *this;
    int shift = num_bits - div_bits;
    div <<= shift; // shift so that div and num align.
    while (shift >= 0) {
        if (num >= div) {
            num -= div;
            pn[shift / 32] |= (1U << (shift & 31)); // set a bit of the result.
        }
        div >>= 1; // shift back.
        shift--;
    }
    // num now contains the remainder of the division.
    return *this;
}